

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_file_renamed
          (torrent *this,string *filename,file_index_t file_idx,storage_error *error)

{
  storage_error *args_1;
  bool bVar1;
  alert_manager *paVar2;
  file_storage *this_00;
  element_type *peVar3;
  allocator<char> local_a1;
  string local_a0;
  file_index_t local_7c;
  string local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [40];
  storage_error *error_local;
  string *filename_local;
  torrent *this_local;
  file_index_t file_idx_local;
  
  local_48._32_8_ = error;
  error_local = (storage_error *)filename;
  filename_local = (string *)this;
  this_local._4_4_ = file_idx.m_val;
  bVar1 = storage_error::operator_cast_to_bool(error);
  if (bVar1) {
    paVar2 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::file_rename_failed_alert>(paVar2);
    if (bVar1) {
      paVar2 = alerts(this);
      get_handle((torrent *)local_48);
      alert_manager::
      emplace_alert<libtorrent::file_rename_failed_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>const&,boost::system::error_code_const&>
                (paVar2,(torrent_handle *)local_48,
                 (strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                 ((long)&this_local + 4),(error_code *)local_48._32_8_);
      torrent_handle::~torrent_handle((torrent_handle *)local_48);
    }
  }
  else {
    paVar2 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::file_renamed_alert>(paVar2);
    if (bVar1) {
      paVar2 = alerts(this);
      get_handle((torrent *)local_58);
      args_1 = error_local;
      peVar3 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      this_00 = torrent_info::files(peVar3);
      local_7c.m_val = this_local._4_4_;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
      file_storage::file_path(&local_78,this_00,local_7c,&local_a0);
      alert_manager::
      emplace_alert<libtorrent::file_renamed_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>const&>
                (paVar2,(torrent_handle *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
                 &local_78,
                 (strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                 ((long)&this_local + 4));
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::allocator<char>::~allocator(&local_a1);
      torrent_handle::~torrent_handle((torrent_handle *)local_58);
    }
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    torrent_info::rename_file(peVar3,this_local._4_4_,(string *)error_local);
    set_need_save_resume(this,(resume_data_flags_t)0x40);
  }
  return;
}

Assistant:

void torrent::on_file_renamed(std::string const& filename
		, file_index_t const file_idx
		, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		if (error)
		{
			if (alerts().should_post<file_rename_failed_alert>())
				alerts().emplace_alert<file_rename_failed_alert>(get_handle()
					, file_idx, error.ec);
		}
		else
		{
			if (alerts().should_post<file_renamed_alert>())
				alerts().emplace_alert<file_renamed_alert>(get_handle()
					, filename, m_torrent_file->files().file_path(file_idx), file_idx);
			m_torrent_file->rename_file(file_idx, filename);

			set_need_save_resume(torrent_handle::if_state_changed);
		}
	}
	catch (...) { handle_exception(); }